

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupIntern(string *name,uint nMaxSolutions,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  string_view str;
  initializer_list<CNetAddr> __l;
  bool bVar1;
  size_type sVar2;
  uint in_EDX;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *in_RDI;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  CNetAddr *resolved;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *__range1;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *addresses;
  iterator __end1;
  iterator __begin1;
  CNetAddr addr;
  CNetAddr *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  CNetAddr *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  CNetAddr *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  allocator_type *in_stack_fffffffffffffed0;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *in_stack_fffffffffffffed8;
  undefined1 *puVar4;
  iterator in_stack_fffffffffffffee0;
  undefined1 local_49;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb8);
  str._M_str._0_7_ = in_stack_fffffffffffffec8;
  str._M_len = (size_t)in_stack_fffffffffffffec0;
  str._M_str._7_1_ = in_stack_fffffffffffffecf;
  bVar1 = util::ContainsNoNUL(str);
  if (bVar1) {
    CNetAddr::CNetAddr((CNetAddr *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    bVar1 = CNetAddr::SetSpecial(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) {
      CNetAddr::CNetAddr(in_stack_fffffffffffffea8,
                         (CNetAddr *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      puVar4 = &local_49;
      std::allocator<CNetAddr>::allocator((allocator<CNetAddr> *)in_stack_fffffffffffffe98);
      __l._M_len = (size_type)puVar4;
      __l._M_array = in_stack_fffffffffffffee0;
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
                (in_stack_fffffffffffffed8,__l,in_stack_fffffffffffffed0);
      std::allocator<CNetAddr>::~allocator((allocator<CNetAddr> *)in_stack_fffffffffffffe98);
      puVar4 = local_48;
      puVar3 = local_28;
      do {
        puVar3 = puVar3 + -0x20;
        CNetAddr::~CNetAddr(in_stack_fffffffffffffe98);
      } while (puVar3 != puVar4);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    CNetAddr::~CNetAddr(in_stack_fffffffffffffe98);
    if (!bVar1) {
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffe98);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::operator()((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                    *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                   (bool)in_stack_fffffffffffffecf);
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::begin
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::end
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      while ((bVar1 = __gnu_cxx::
                      operator==<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                ((__normal_iterator<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                  *)in_stack_fffffffffffffea8,
                                 (__normal_iterator<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)),
             ((bVar1 ^ 0xffU) & 1) != 0 &&
             ((__gnu_cxx::
               __normal_iterator<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>::
               operator*((__normal_iterator<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                          *)in_stack_fffffffffffffe98), in_EDX == 0 ||
              (sVar2 = std::vector<CNetAddr,_std::allocator<CNetAddr>_>::size
                                 ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)
                                  in_stack_fffffffffffffe98), sVar2 < in_EDX))))) {
        in_stack_fffffffffffffea7 = CNetAddr::IsInternal(in_stack_fffffffffffffe98);
        if (!(bool)in_stack_fffffffffffffea7) {
          std::vector<CNetAddr,_std::allocator<CNetAddr>_>::push_back
                    ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffea8,
                     (value_type *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
        }
        __gnu_cxx::__normal_iterator<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
        ::operator++((__normal_iterator<CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                      *)in_stack_fffffffffffffe98);
      }
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffea8);
    }
  }
  else {
    memset(in_RDI,0,0x18);
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
              ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffe98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<CNetAddr> LookupIntern(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    {
        CNetAddr addr;
        // From our perspective, onion addresses are not hostnames but rather
        // direct encodings of CNetAddr much like IPv4 dotted-decimal notation
        // or IPv6 colon-separated hextet notation. Since we can't use
        // getaddrinfo to decode them and it wouldn't make sense to resolve
        // them, we return a network address representing it instead. See
        // CNetAddr::SetSpecial(const std::string&) for more details.
        if (addr.SetSpecial(name)) return {addr};
    }

    std::vector<CNetAddr> addresses;

    for (const CNetAddr& resolved : dns_lookup_function(name, fAllowLookup)) {
        if (nMaxSolutions > 0 && addresses.size() >= nMaxSolutions) {
            break;
        }
        /* Never allow resolving to an internal address. Consider any such result invalid */
        if (!resolved.IsInternal()) {
            addresses.push_back(resolved);
        }
    }

    return addresses;
}